

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_GetStringReferenceCopy_Test::
TestBody(GeneratedMessageReflectionTest_GetStringReferenceCopy_Test *this)

{
  bool bVar1;
  Reflection *this_00;
  Descriptor *this_01;
  FieldDescriptor *field;
  char *message;
  AssertHelper local_d8;
  Message local_d0;
  string_view local_c8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  string cord_scratch;
  Descriptor *descriptor;
  Reflection *cord_reflection;
  string_view local_58;
  undefined1 local_48 [8];
  TestCord cord_message;
  GeneratedMessageReflectionTest_GetStringReferenceCopy_Test *this_local;
  
  cord_message.field_0._32_8_ = this;
  proto2_unittest::TestCord::TestCord((TestCord *)local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"bytes_cord");
  proto2_unittest::TestCord::set_optional_bytes_cord((TestCord *)local_48,local_58);
  this_00 = proto2_unittest::TestCord::GetReflection();
  this_01 = proto2_unittest::TestCord::descriptor();
  std::__cxx11::string::string((string *)&gtest_ar.message_);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,"optional_bytes_cord");
  field = Descriptor::FindFieldByName(this_01,local_c8);
  local_b8 = Reflection::GetStringReference
                       (this_00,(Message *)local_48,field,(string *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_nullptr>
            ((EqHelper *)local_a8,"&cord_scratch",
             "&cord_reflection->GetStringReference( cord_message, descriptor->FindFieldByName(\"optional_bytes_cord\"), &cord_scratch)"
             ,&local_b0,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0xaa,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  proto2_unittest::TestCord::~TestCord((TestCord *)local_48);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetStringReferenceCopy) {
  // Test that GetStringReference() returns the scratch string when the
  // underlying representation is not a normal string.
  unittest::TestCord cord_message;
  cord_message.set_optional_bytes_cord("bytes_cord");

  const Reflection* cord_reflection = cord_message.GetReflection();
  const Descriptor* descriptor = unittest::TestCord::descriptor();
  std::string cord_scratch;
  EXPECT_EQ(
      &cord_scratch,
      &cord_reflection->GetStringReference(
          cord_message, descriptor->FindFieldByName("optional_bytes_cord"),
          &cord_scratch));
}